

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.h
# Opt level: O0

bool __thiscall
btHashedOverlappingPairCache::needsBroadphaseCollision
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  byte bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool collides;
  undefined1 local_31;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    local_31 = false;
    if ((*(ushort *)(in_RSI + 8) & *(ushort *)(in_RDX + 10)) != 0) {
      local_31 = (*(ushort *)(in_RDX + 8) & *(ushort *)(in_RSI + 10)) != 0;
    }
    local_1 = local_31;
  }
  else {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                      (*(long **)(in_RDI + 0x28),in_RSI,in_RDX);
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

SIMD_FORCE_INLINE bool needsBroadphaseCollision(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1) const
	{
		if (m_overlapFilterCallback)
			return m_overlapFilterCallback->needBroadphaseCollision(proxy0,proxy1);

		bool collides = (proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) != 0;
		collides = collides && (proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask);
		
		return collides;
	}